

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_DataType(void)

{
  uint uVar1;
  char *dt_str;
  
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
  if (uVar1 != 0) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN);
  if (uVar1 != 1) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,1);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
  if (uVar1 != 2) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,2);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
  if (uVar1 != 3) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,3);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
  if (uVar1 != 4) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,4);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
  if (uVar1 != 5) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,5);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
  if (uVar1 != 6) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,6);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME);
  if (uVar1 != 7) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,7);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
  if (uVar1 != 8) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,8);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
  if (uVar1 != 9) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,9);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR);
  if (uVar1 != 10) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,10);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY);
  if (uVar1 != 0xb) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0xb);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
  if (uVar1 != 0xc) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0xc);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
  if (uVar1 != 0xd) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0xd);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY);
  if (uVar1 != 0xe) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0xe);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType
                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
  if (uVar1 != 0xf) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0xf);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  if (uVar1 != 0x10) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x10);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
  if (uVar1 != 0x11) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x11);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgNotationString);
  if (uVar1 != 0x12) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgNotationString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x12);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType
                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING);
  if (uVar1 != 0x13) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x13);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
  if (uVar1 != 0x14) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x14);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
  if (uVar1 != 0x15) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x15);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString);
  if (uVar1 != 0x16) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x16);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString);
  if (uVar1 != 0x17) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x17);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME);
  if (uVar1 != 0x18) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x18);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME);
  if (uVar1 != 0x19) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x19);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgIDString);
  if (uVar1 != 0x1a) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x1a);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString);
  if (uVar1 != 0x1b) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x1b);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString);
  if (uVar1 != 0x1c) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x1c);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString);
  if (uVar1 != 0x1d) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x1d);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString);
  if (uVar1 != 0x1e) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x1e);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
  if (uVar1 != 0x1f) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x1f);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType
                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  if (uVar1 != 0x20) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x20);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType
                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER);
  if (uVar1 != 0x21) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x21);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG);
  if (uVar1 != 0x22) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x22);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
  if (uVar1 != 0x23) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x23);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
  if (uVar1 != 0x24) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x24);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
  if (uVar1 != 0x25) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x25);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType
                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  if (uVar1 != 0x26) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x26);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG);
  if (uVar1 != 0x27) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x27);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
  if (uVar1 != 0x28) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x28);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
  if (uVar1 != 0x29) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x29);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
  if (uVar1 != 0x2a) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x2a);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType
                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
  if (uVar1 != 0x2b) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x2b);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  uVar1 = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgLongMaxInc);
  if (uVar1 != 0x2c) {
    dt_str = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgLongMaxInc,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",dt_str,
           (ulong)uVar1,0x2c);
    xercesc_4_0::XMLString::release(&dt_str,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = 1;
  }
  return;
}

Assistant:

void test_DataType()
{

    DATATYPE_TEST( SchemaSymbols::fgDT_STRING,             XSValue::dt_string);
    DATATYPE_TEST( SchemaSymbols::fgDT_BOOLEAN,            XSValue::dt_boolean);
    DATATYPE_TEST( SchemaSymbols::fgDT_DECIMAL,            XSValue::dt_decimal);
    DATATYPE_TEST( SchemaSymbols::fgDT_FLOAT,              XSValue::dt_float);
    DATATYPE_TEST( SchemaSymbols::fgDT_DOUBLE,             XSValue::dt_double);
    DATATYPE_TEST( SchemaSymbols::fgDT_DURATION,           XSValue::dt_duration);
    DATATYPE_TEST( SchemaSymbols::fgDT_DATETIME,           XSValue::dt_dateTime);
    DATATYPE_TEST( SchemaSymbols::fgDT_TIME,               XSValue::dt_time);
    DATATYPE_TEST( SchemaSymbols::fgDT_DATE,               XSValue::dt_date);
    DATATYPE_TEST( SchemaSymbols::fgDT_YEARMONTH,          XSValue::dt_gYearMonth);
    DATATYPE_TEST( SchemaSymbols::fgDT_YEAR,               XSValue::dt_gYear);
    DATATYPE_TEST( SchemaSymbols::fgDT_MONTHDAY,           XSValue::dt_gMonthDay);
    DATATYPE_TEST( SchemaSymbols::fgDT_DAY,                XSValue::dt_gDay);
    DATATYPE_TEST( SchemaSymbols::fgDT_MONTH,              XSValue::dt_gMonth);
    DATATYPE_TEST( SchemaSymbols::fgDT_HEXBINARY,          XSValue::dt_hexBinary);
    DATATYPE_TEST( SchemaSymbols::fgDT_BASE64BINARY,       XSValue::dt_base64Binary);
    DATATYPE_TEST( SchemaSymbols::fgDT_ANYURI,             XSValue::dt_anyURI);
    DATATYPE_TEST( SchemaSymbols::fgDT_QNAME,              XSValue::dt_QName);
    DATATYPE_TEST( XMLUni::fgNotationString,               XSValue::dt_NOTATION);
    DATATYPE_TEST( SchemaSymbols::fgDT_NORMALIZEDSTRING,   XSValue::dt_normalizedString);
    DATATYPE_TEST( SchemaSymbols::fgDT_TOKEN,              XSValue::dt_token);
    DATATYPE_TEST( SchemaSymbols::fgDT_LANGUAGE,           XSValue::dt_language);
    DATATYPE_TEST( XMLUni::fgNmTokenString,                XSValue::dt_NMTOKEN);
    DATATYPE_TEST( XMLUni::fgNmTokensString,               XSValue::dt_NMTOKENS);
    DATATYPE_TEST( SchemaSymbols::fgDT_NAME,               XSValue::dt_Name);
    DATATYPE_TEST( SchemaSymbols::fgDT_NCNAME,             XSValue::dt_NCName);
    DATATYPE_TEST( XMLUni::fgIDString,                     XSValue::dt_ID);
    DATATYPE_TEST( XMLUni::fgIDRefString,                  XSValue::dt_IDREF);
    DATATYPE_TEST( XMLUni::fgIDRefsString,                 XSValue::dt_IDREFS);
    DATATYPE_TEST( XMLUni::fgEntityString,                 XSValue::dt_ENTITY);
    DATATYPE_TEST( XMLUni::fgEntitiesString,               XSValue::dt_ENTITIES);
    DATATYPE_TEST( SchemaSymbols::fgDT_INTEGER,            XSValue::dt_integer);
    DATATYPE_TEST( SchemaSymbols::fgDT_NONPOSITIVEINTEGER, XSValue::dt_nonPositiveInteger);
    DATATYPE_TEST( SchemaSymbols::fgDT_NEGATIVEINTEGER,    XSValue::dt_negativeInteger);
    DATATYPE_TEST( SchemaSymbols::fgDT_LONG,               XSValue::dt_long);
    DATATYPE_TEST( SchemaSymbols::fgDT_INT,                XSValue::dt_int);
    DATATYPE_TEST( SchemaSymbols::fgDT_SHORT,              XSValue::dt_short);
    DATATYPE_TEST( SchemaSymbols::fgDT_BYTE,               XSValue::dt_byte);
    DATATYPE_TEST( SchemaSymbols::fgDT_NONNEGATIVEINTEGER, XSValue::dt_nonNegativeInteger);
    DATATYPE_TEST( SchemaSymbols::fgDT_ULONG,              XSValue::dt_unsignedLong);
    DATATYPE_TEST( SchemaSymbols::fgDT_UINT,               XSValue::dt_unsignedInt);
    DATATYPE_TEST( SchemaSymbols::fgDT_USHORT,             XSValue::dt_unsignedShort);
    DATATYPE_TEST( SchemaSymbols::fgDT_UBYTE,              XSValue::dt_unsignedByte);
    DATATYPE_TEST( SchemaSymbols::fgDT_POSITIVEINTEGER,    XSValue::dt_positiveInteger);

    DATATYPE_TEST( XMLUni::fgLongMaxInc,                   XSValue::dt_MAXCOUNT);
}